

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::IntermediateNode::
destroyChildren(IntermediateNode *this)

{
  IntermediateNode *pIVar1;
  int iVar2;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Node_**>
  *in_RAX;
  undefined4 extraout_var;
  IntermediateNode *in;
  NodeIterator children;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Node_**>
  local_28;
  
  local_28._core = in_RAX;
  if (destroyChildren()::toDelete == '\0') {
    iVar2 = __cxa_guard_acquire(&destroyChildren()::toDelete);
    if (iVar2 != 0) {
      destroyChildren::toDelete._cursor = (Node **)0x0;
      destroyChildren::toDelete._end = (Node **)0x0;
      destroyChildren::toDelete._capacity = 0;
      destroyChildren::toDelete._stack = (Node **)0x0;
      __cxa_atexit(Lib::
                   Stack<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Node_*>
                   ::~Stack,&destroyChildren::toDelete,&__dso_handle);
      __cxa_guard_release(&destroyChildren()::toDelete);
    }
  }
  destroyChildren::toDelete._cursor = destroyChildren::toDelete._stack;
  Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Node_*>::push
            (&destroyChildren::toDelete,&this->super_Node);
  while (destroyChildren::toDelete._cursor != destroyChildren::toDelete._stack) {
    pIVar1 = (IntermediateNode *)destroyChildren::toDelete._cursor[-1];
    destroyChildren::toDelete._cursor = destroyChildren::toDelete._cursor + -1;
    iVar2 = (*(pIVar1->super_Node)._vptr_Node[2])(pIVar1);
    if ((char)iVar2 == '\0') {
      (*(pIVar1->super_Node)._vptr_Node[8])(&local_28,pIVar1);
      while( true ) {
        iVar2 = (*(local_28._core)->_vptr_IteratorCore[2])();
        if ((char)iVar2 == '\0') break;
        iVar2 = (*(local_28._core)->_vptr_IteratorCore[3])();
        Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Node_*>::
        push(&destroyChildren::toDelete,*(Node **)CONCAT44(extraout_var,iVar2));
      }
      (*(pIVar1->super_Node)._vptr_Node[0xc])(pIVar1);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::Node_**>
      ::~VirtualIterator(&local_28);
    }
    if (pIVar1 != this) {
      (*(pIVar1->super_Node)._vptr_Node[1])(pIVar1);
    }
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::destroyChildren()
{
  static Stack<Node*> toDelete;
  toDelete.reset();
  toDelete.push(this);
  while(toDelete.isNonEmpty()) {
    Node* n=toDelete.pop();
    if(!n->isLeaf()) {
      IntermediateNode* in=static_cast<IntermediateNode*>(n);
      NodeIterator children=in->allChildren();
      while(children.hasNext()) {
	toDelete.push(*children.next());
      }
      in->removeAllChildren();
    }
    if(n!=this) {
      delete n;
    }
  }
}